

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

bool minihttp::SplitURI(string *uri,string *protocol,string *host,string *file,int *port,
                       bool *useSSL)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  size_t colon;
  string local_88 [32];
  ulong local_68;
  size_t firstslash;
  size_t colon_1;
  bool ssl;
  char *pcStack_50;
  uint offs;
  char *sl;
  char *p;
  bool *useSSL_local;
  int *port_local;
  string *file_local;
  string *host_local;
  string *protocol_local;
  string *uri_local;
  
  p = useSSL;
  useSSL_local = (bool *)port;
  port_local = (int *)file;
  file_local = host;
  host_local = protocol;
  protocol_local = uri;
  sl = (char *)std::__cxx11::string::c_str();
  pcStack_50 = strstr(sl,"//");
  colon_1._4_4_ = 0;
  useSSL_local[0] = true;
  useSSL_local[1] = true;
  useSSL_local[2] = true;
  useSSL_local[3] = true;
  colon_1._3_1_ = 0;
  if (pcStack_50 != (char *)0x0) {
    firstslash = std::__cxx11::string::find((char)protocol_local,0x3a);
    local_68 = std::__cxx11::string::find((char)protocol_local,0x2f);
    if (firstslash < local_68) {
      std::__cxx11::string::substr((ulong)local_88,(ulong)protocol_local);
      std::__cxx11::string::operator=((string *)host_local,local_88);
      std::__cxx11::string::~string(local_88);
    }
    iVar1 = strncmp(sl,"http://",7);
    if (iVar1 == 0) {
      colon_1._4_4_ = 7;
      useSSL_local[0] = true;
      useSSL_local[1] = false;
      useSSL_local[2] = false;
      useSSL_local[3] = false;
    }
    else {
      iVar1 = strncmp(sl,"https://",8);
      if (iVar1 != 0) {
        return false;
      }
      colon_1._4_4_ = 8;
      useSSL_local[0] = true;
      useSSL_local[1] = true;
      useSSL_local[2] = false;
      useSSL_local[3] = false;
      colon_1._3_1_ = 1;
    }
    sl = pcStack_50 + 2;
  }
  pcStack_50 = strchr(sl,0x2f);
  if (pcStack_50 == (char *)0x0) {
    std::__cxx11::string::operator=((string *)file_local,sl);
    std::__cxx11::string::operator=((string *)port_local,"/");
  }
  else {
    std::__cxx11::string::substr((ulong)&colon,(ulong)protocol_local);
    std::__cxx11::string::operator=((string *)file_local,(string *)&colon);
    std::__cxx11::string::~string((string *)&colon);
    std::__cxx11::string::operator=((string *)port_local,pcStack_50);
  }
  uVar2 = std::__cxx11::string::find((char)file_local,0x3a);
  if (uVar2 != 0xffffffffffffffff) {
    lVar3 = std::__cxx11::string::c_str();
    iVar1 = atoi((char *)(lVar3 + uVar2 + 1));
    *(int *)useSSL_local = iVar1;
    std::__cxx11::string::erase((ulong)file_local,uVar2);
  }
  *p = colon_1._3_1_ & 1;
  return true;
}

Assistant:

bool SplitURI(const std::string& uri, std::string& protocol, std::string& host, std::string& file, int& port, bool& useSSL)
{
    const char *p = uri.c_str();
    const char *sl = strstr(p, "//");
    unsigned int offs = 0;
    port = -1;
    bool ssl = false;
    if(sl)
    {
        size_t colon = uri.find(':');
        size_t firstslash = uri.find('/');
        if(colon < firstslash)
            protocol = uri.substr(0, colon);
        if(strncmp(p, "http://", 7) == 0)
        {
            offs = 7;
            port = 80;
        }
        else if(strncmp(p, "https://", 8) == 0)
        {
            offs = 8;
            port = 443;
            ssl = true;
        }
        else
            return false;

        p = sl + 2;
    }

    sl = strchr(p, '/');
    if(!sl)
    {
        host = p;
        file = "/";
    }
    else
    {
        host = uri.substr(offs, sl - p);
        file = sl;
    }

    size_t colon = host.find(':');
    if(colon != std::string::npos)
    {
        port = atoi(host.c_str() + colon + 1);
        host.erase(colon);
    }
    useSSL = ssl;

    return true;
}